

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O0

void __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::add(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      *this,int n,int *i,
     number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
     *v)

{
  type_conflict5 tVar1;
  int iVar2;
  int *in_RDX;
  int in_ESI;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *e;
  int newnnz;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *v_00;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_40;
  int local_34;
  int *local_28;
  int local_1c;
  
  if (0 < in_ESI) {
    local_34 = 0;
    v_00 = *(Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             **)(in_RDI->data)._M_elems;
    iVar2 = size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_RDI);
    local_40 = v_00 + iVar2;
    local_28 = in_RDX;
    local_1c = in_ESI;
    while (local_1c != 0) {
      tVar1 = boost::multiprecision::operator!=(&v_00->val,(double *)0x69642c);
      if (tVar1) {
        local_40->idx = *local_28;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_RDI,(cpp_dec_float<200U,_int,_void> *)v_00);
        local_40 = local_40 + 1;
        local_34 = local_34 + 1;
      }
      local_28 = local_28 + 1;
      local_1c = local_1c + -1;
    }
    iVar2 = size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_RDI);
    set_size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)in_RDI,iVar2 + local_34);
  }
  return;
}

Assistant:

void add(int n, const int i[], const R v[])
   {
      assert(n + size() <= max());

      if(n <= 0)
         return;

      int newnnz = 0;

      Nonzero<R>* e = m_elem + size();

      while(n--)
      {
         if(*v != 0.0)
         {
            assert(e != nullptr);
            e->idx = *i;
            e->val = *v;
            e++;
            ++newnnz;
         }

         i++;
         v++;
      }

      set_size(size() + newnnz);
   }